

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManMatrPrint(Sbd_Man_t *p,word *Cover,int nCol,int nRows)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (nRows < 1) {
    nRows = 0;
  }
  for (uVar3 = 0; (long)uVar3 <= (long)nCol; uVar3 = uVar3 + 1) {
    printf("%2d : ",uVar3 & 0xffffffff);
    p_00 = p->vLutLevs;
    if (uVar3 == (uint)nCol) {
      iVar1 = p->Pivot;
    }
    else {
      p_01 = p->vWinObjs;
      iVar1 = Vec_IntEntry(p->vDivVars,(int)uVar3);
      iVar1 = Vec_IntEntry(p_01,iVar1);
    }
    uVar2 = Vec_IntEntry(p_00,iVar1);
    printf("%d ",(ulong)uVar2);
    for (uVar4 = 0; (uint)nRows != uVar4; uVar4 = uVar4 + 1) {
      printf("%d",(ulong)((Cover[uVar3] >> (uVar4 & 0x3f) & 1) != 0));
    }
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

void Sbd_ManMatrPrint( Sbd_Man_t * p, word Cover[], int nCol, int nRows )
{
    int i, k;
    for ( i = 0; i <= nCol; i++ )
    {
        printf( "%2d : ", i );
        printf( "%d ", i == nCol ? Vec_IntEntry(p->vLutLevs, p->Pivot) : Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
        for ( k = 0; k < nRows; k++ )
            printf( "%d", (int)((Cover[i] >> k) & 1) );
        printf( "\n"); 
    }
    printf( "\n");
}